

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodePsbtOutputStruct * __thiscall
cfd::api::json::DecodePsbtOutput::ConvertToStruct(DecodePsbtOutput *this)

{
  DecodePsbtOutputStruct *in_RDI;
  DecodePsbtOutputStruct *result;
  PsbtScriptDataStruct *in_stack_fffffffffffffe48;
  PsbtScriptDataStruct *in_stack_fffffffffffffe50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *__x;
  DecodePsbtOutputStruct *in_stack_fffffffffffffe60;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *this_01;
  undefined1 local_178 [48];
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> local_148 [3];
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *in_stack_ffffffffffffff08;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *in_stack_ffffffffffffff48;
  
  DecodePsbtOutputStruct::DecodePsbtOutputStruct(in_stack_fffffffffffffe60);
  PsbtScriptData::ConvertToStruct((PsbtScriptData *)in_RDI);
  PsbtScriptDataStruct::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  PsbtScriptDataStruct::~PsbtScriptDataStruct(in_stack_fffffffffffffe50);
  PsbtScriptData::ConvertToStruct((PsbtScriptData *)in_RDI);
  this_01 = local_148;
  PsbtScriptDataStruct::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  PsbtScriptDataStruct::~PsbtScriptDataStruct(in_stack_fffffffffffffe50);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
            (in_stack_ffffffffffffff48);
  __x = (vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)(local_178 + 0x18);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::operator=(this_01,__x);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector(this_01);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            (in_stack_ffffffffffffff08);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178;
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::operator=
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)this_01,
             (vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)__x);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)this_01);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe48);
  return in_RDI;
}

Assistant:

DecodePsbtOutputStruct DecodePsbtOutput::ConvertToStruct() const {  // NOLINT
  DecodePsbtOutputStruct result;
  result.redeem_script = redeem_script_.ConvertToStruct();
  result.witness_script = witness_script_.ConvertToStruct();
  result.bip32_derivs = bip32_derivs_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}